

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O1

u16 __thiscall YAJLHuffmanTable::HFTree::decode(HFTree *this,bitio_stream *bstream)

{
  HFNode *pHVar1;
  uint64_t uVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  HFNode *pHVar4;
  
  pHVar1 = this->root;
  pHVar4 = pHVar1->left;
  while ((pHVar4 != (HFNode *)0x0 && (pHVar1->right != (HFNode *)0x0))) {
    uVar2 = bitio::bitio_stream::peek(bstream,'\b');
    __buf = extraout_RDX;
    if ((uVar2 == 0xff) &&
       (uVar2 = bitio::bitio_stream::peek(bstream,'\x10'), __buf = extraout_RDX_00, uVar2 == 0xff00)
       ) {
      this->count_bstuff = true;
      this->bstuff_count = '\0';
    }
    if (this->count_bstuff == true) {
      this->bstuff_count = this->bstuff_count + '\x01';
    }
    if (this->bstuff_count == '\b') {
      this->count_bstuff = false;
      this->bstuff_count = '\0';
      bitio::bitio_stream::skip(bstream,8);
      __buf = extraout_RDX_01;
    }
    sVar3 = bitio::bitio_stream::read(bstream,1,__buf,in_RCX);
    pHVar4 = (HFNode *)&pHVar1->right;
    if (sVar3 == 0) {
      pHVar4 = pHVar1;
    }
    pHVar1 = pHVar4->left;
    pHVar4 = pHVar1->left;
  }
  return (u16)pHVar1->symbol;
}

Assistant:

u16 YAJLHuffmanTable::HFTree::decode(bitio::bitio_stream *bstream) {
    auto *curr = root;
    while (curr->left != nullptr && curr->right != nullptr) {
        if (bstream->peek(0x8) == 0xFF) {
            auto pkval = bstream->peek(0x10);
            if (pkval == 0xFF00) {
                count_bstuff = true;
                bstuff_count = 0;
            }
        }

        if (count_bstuff) {
            bstuff_count++;
        }
        if (bstuff_count == 8) {
            bstuff_count = 0;
            count_bstuff = false;
            bstream->skip(0x8);
        }

        bool msb = bstream->read(0x1);
        if (msb) {
            curr = curr->right;
        } else {
            curr = curr->left;
        }
    }
    return curr->symbol;
}